

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_trace_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  parasail_result_t *ppVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i *palVar46;
  __m128i *palVar47;
  __m128i *palVar48;
  __m128i *palVar49;
  ushort uVar50;
  short sVar51;
  int a;
  int iVar52;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  __m128i *palVar53;
  int seglen;
  int32_t in_R9D;
  ushort uVar54;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar65;
  ushort uVar67;
  undefined1 auVar55 [16];
  ushort uVar66;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ulong uVar64;
  __m128i alVar72;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  ulong local_f18;
  long local_f08;
  long local_f00;
  ulong uStack_ed8;
  __m128i vH_1;
  __m128i vT_5;
  __m128i cond_4;
  __m128i vEa_ext_1;
  __m128i vEa_1;
  __m128i vT_4;
  __m128i cond_3;
  __m128i vTAll_3;
  __m128i cond_2;
  __m128i case2_1;
  __m128i case1_1;
  __m128i vT_3;
  __m128i vTAll_2;
  __m128i vHp;
  int16_t tmp2;
  int64_t tmp_4;
  __m128i vT_2;
  __m128i cond_1;
  __m128i vTAll_1;
  __m128i vT_1;
  __m128i cond;
  __m128i vEa_ext;
  __m128i vEa;
  __m128i vT;
  __m128i case2;
  __m128i case1;
  __m128i vTAll;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vP;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFa_ext;
  __m128i vFa;
  __m128i vF_ext;
  __m128i vF;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int local_c50;
  int local_c4c;
  int32_t segNum;
  int32_t index;
  __m128i vFTMask;
  __m128i vTMask;
  __m128i vTDelF;
  __m128i vTDiagF;
  __m128i vTInsE;
  __m128i vTDiagE;
  __m128i vTDiag;
  __m128i vTDel;
  __m128i vTIns;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_b5e;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvHT;
  __m128i *pvEaLoad;
  __m128i *pvEaStore;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_ad0;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short sStack_870;
  short sStack_86e;
  short sStack_86c;
  short sStack_86a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  ushort local_838;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_830;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short local_7d8;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7d0;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  ushort local_798;
  ushort uStack_796;
  ushort uStack_794;
  ushort uStack_792;
  ushort uStack_790;
  ushort uStack_78e;
  ushort uStack_78c;
  ushort uStack_78a;
  short local_778;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_770;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  ushort local_768;
  ushort uStack_766;
  ushort uStack_764;
  ushort uStack_762;
  ushort uStack_760;
  ushort uStack_75e;
  ushort uStack_75c;
  ushort uStack_75a;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  ushort local_698;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_690;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse41_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_trace_striped_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_trace_striped_profile_sse41_128_16","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_trace_striped_profile_sse41_128_16","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_trace_striped_profile_sse41_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_ad0 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    a = (iVar1 + 7) / 8;
    pvVar3 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar4 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar7 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar5 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar8 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    if (ppVar2->min <= -open) {
      i._0_2_ = -(short)ppVar2->min;
    }
    uVar50 = (short)i + 0x8001;
    sVar51 = ((ushort)ppVar2->max ^ 0x7fff) - 1;
    ppVar6 = (parasail_result_t *)CONCAT26(uVar50,CONCAT24(uVar50,CONCAT22(uVar50,uVar50)));
    lVar9 = CONCAT26(uVar50,CONCAT24(uVar50,CONCAT22(uVar50,uVar50)));
    vSaturationCheckMax[1] = CONCAT26(sVar51,CONCAT24(sVar51,CONCAT22(sVar51,sVar51)));
    vSaturationCheckMin[0] = CONCAT26(sVar51,CONCAT24(sVar51,CONCAT22(sVar51,sVar51)));
    vFTMask[1] = 0x78007800780078;
    _segNum = 0x1f001f001f001f;
    vFTMask[0] = 0x1f001f001f001f;
    seglen = gap;
    profile_local = (parasail_profile_t *)parasail_result_new_trace(a,s2Len,0x10,0x10);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8280801;
      pvHLoad = parasail_memalign___m128i(0x10,(long)a);
      pvE = parasail_memalign___m128i(0x10,(long)a);
      ptr = parasail_memalign___m128i(0x10,(long)a);
      pvEaLoad = parasail_memalign___m128i(0x10,(long)a);
      pvHT = parasail_memalign___m128i(0x10,(long)a);
      ptr_00 = parasail_memalign___m128i(0x10,(long)a);
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvEaLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHT == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        local_c4c = 0;
        for (k = 0; k < a; k = k + 1) {
          for (local_c50 = 0; local_c50 < 8; local_c50 = local_c50 + 1) {
            local_f08 = (long)(-(gap * (local_c50 * a + k)) - open);
            local_f00 = local_f08;
            if (local_f08 < -0x8000) {
              local_f00 = -0x8000;
            }
            *(short *)((long)&e + (long)local_c50 * 2 + 8) = (short)local_f00;
            local_f08 = local_f08 - open;
            if (local_f08 < -0x8000) {
              local_f08 = -0x8000;
            }
            *(short *)((long)&tmp + (long)local_c50 * 2) = (short)local_f08;
          }
          pvHLoad[local_c4c][0] = e.m[1];
          pvHLoad[local_c4c][1] = h.m[0];
          ptr[local_c4c][0] = tmp;
          ptr[local_c4c][1] = e.m[0];
          pvEaLoad[local_c4c][0] = tmp;
          pvEaLoad[local_c4c][1] = e.m[0];
          local_c4c = local_c4c + 1;
        }
        *ptr_01 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar52 = -(gap * (k + -1)) - open;
          if (iVar52 < -0x8000) {
            iVar52 = -0x8000;
          }
          ptr_01[k] = (int16_t)iVar52;
        }
        for (k = 0; k < a; k = k + 1) {
          alVar72[0] = (ulong)(uint)k;
          alVar72[1]._0_4_ = a;
          alVar72[1]._4_4_ = 0;
          arr_store((__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row,alVar72,0,seglen,in_R9D);
        }
        result = ppVar6;
        vSaturationCheckMax[0] = lVar9;
        for (s1Len = 0; palVar49 = pvHLoad, palVar48 = pvE, palVar47 = pvEaLoad, palVar46 = pvHT,
            s1Len < s2Len; s1Len = s1Len + 1) {
          uVar64 = pvHLoad[a + -1][0];
          vH[0] = pvHLoad[a + -1][1] << 0x10 | uVar64 >> 0x30;
          vH_dag[1] = uVar64 << 0x10 | (ulong)(ushort)ptr_01[s1Len];
          iVar52 = ppVar2->mapper[(byte)s2[s1Len]] * a;
          pvE = pvHLoad;
          pvHLoad = palVar48;
          pvHT = pvEaLoad;
          pvEaLoad = palVar46;
          vF_ext[1] = (longlong)ppVar6;
          vF[0] = lVar9;
          for (k = 0; k < a; k = k + 1) {
            palVar53 = ptr + k;
            lVar10 = (*palVar53)[0];
            lVar11 = (*palVar53)[1];
            alVar72 = *palVar53;
            auVar55._8_8_ = vH[0];
            auVar55._0_8_ = vH_dag[1];
            auVar55 = paddsw(auVar55,*(undefined1 (*) [16])
                                      ((long)pvVar3 + (long)k * 0x10 + (long)iVar52 * 0x10));
            local_768 = auVar55._0_2_;
            uStack_766 = auVar55._2_2_;
            uStack_764 = auVar55._4_2_;
            uStack_762 = auVar55._6_2_;
            uStack_760 = auVar55._8_2_;
            uStack_75e = auVar55._10_2_;
            uStack_75c = auVar55._12_2_;
            uStack_75a = auVar55._14_2_;
            local_778 = (short)lVar10;
            sStack_776 = (short)((ulong)lVar10 >> 0x10);
            sStack_774 = (short)((ulong)lVar10 >> 0x20);
            sStack_772 = (short)((ulong)lVar10 >> 0x30);
            sStack_770 = (short)lVar11;
            sStack_76e = (short)((ulong)lVar11 >> 0x10);
            sStack_76c = (short)((ulong)lVar11 >> 0x20);
            sStack_76a = (short)((ulong)lVar11 >> 0x30);
            uVar54 = (ushort)((short)local_768 < local_778) * local_778 |
                     ((short)local_768 >= local_778) * local_768;
            uVar56 = (ushort)((short)uStack_766 < sStack_776) * sStack_776 |
                     ((short)uStack_766 >= sStack_776) * uStack_766;
            uVar58 = (ushort)((short)uStack_764 < sStack_774) * sStack_774 |
                     ((short)uStack_764 >= sStack_774) * uStack_764;
            uVar60 = (ushort)((short)uStack_762 < sStack_772) * sStack_772 |
                     ((short)uStack_762 >= sStack_772) * uStack_762;
            uVar62 = (ushort)((short)uStack_760 < sStack_770) * sStack_770 |
                     ((short)uStack_760 >= sStack_770) * uStack_760;
            uVar65 = (ushort)((short)uStack_75e < sStack_76e) * sStack_76e |
                     ((short)uStack_75e >= sStack_76e) * uStack_75e;
            uVar67 = (ushort)((short)uStack_75c < sStack_76c) * sStack_76c |
                     ((short)uStack_75c >= sStack_76c) * uStack_75c;
            uVar69 = (ushort)((short)uStack_75a < sStack_76a) * sStack_76a |
                     ((short)uStack_75a >= sStack_76a) * uStack_75a;
            local_798 = (ushort)vF_ext[1];
            uStack_796 = (ushort)((ulong)vF_ext[1] >> 0x10);
            uStack_794 = (ushort)((ulong)vF_ext[1] >> 0x20);
            uStack_792 = (ushort)((ulong)vF_ext[1] >> 0x30);
            uStack_790 = (ushort)vF[0];
            uStack_78e = (ushort)((ulong)vF[0] >> 0x10);
            uStack_78c = (ushort)((ulong)vF[0] >> 0x20);
            uStack_78a = (ushort)((ulong)vF[0] >> 0x30);
            uVar54 = ((short)uVar54 < (short)local_798) * local_798 |
                     ((short)uVar54 >= (short)local_798) * uVar54;
            uVar57 = ((short)uVar56 < (short)uStack_796) * uStack_796 |
                     ((short)uVar56 >= (short)uStack_796) * uVar56;
            uVar59 = ((short)uVar58 < (short)uStack_794) * uStack_794 |
                     ((short)uVar58 >= (short)uStack_794) * uVar58;
            uVar61 = ((short)uVar60 < (short)uStack_792) * uStack_792 |
                     ((short)uVar60 >= (short)uStack_792) * uVar60;
            uVar63 = ((short)uVar62 < (short)uStack_790) * uStack_790 |
                     ((short)uVar62 >= (short)uStack_790) * uVar62;
            uVar66 = ((short)uVar65 < (short)uStack_78e) * uStack_78e |
                     ((short)uVar65 >= (short)uStack_78e) * uVar65;
            uVar68 = ((short)uVar67 < (short)uStack_78c) * uStack_78c |
                     ((short)uVar67 >= (short)uStack_78c) * uVar67;
            uVar70 = ((short)uVar69 < (short)uStack_78a) * uStack_78a |
                     ((short)uVar69 >= (short)uStack_78a) * uVar69;
            vH_dag[1]._0_4_ = CONCAT22(uVar57,uVar54);
            vH_dag[1]._0_6_ = CONCAT24(uVar59,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar61,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar66,uVar63);
            vH[0]._0_6_ = CONCAT24(uVar68,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar70,(undefined6)vH[0]);
            palVar48[k][0] = vH_dag[1];
            palVar48[k][1] = vH[0];
            local_7a8 = (short)result;
            sStack_7a6 = (short)((ulong)result >> 0x10);
            sStack_7a4 = (short)((ulong)result >> 0x20);
            sStack_7a2 = (short)((ulong)result >> 0x30);
            sStack_7a0 = (short)vSaturationCheckMax[0];
            sStack_79e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_79c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_79a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            result._0_4_ = CONCAT22((sStack_7a6 < (short)uVar57) * uVar57 |
                                    (ushort)(sStack_7a6 >= (short)uVar57) * sStack_7a6,
                                    (local_7a8 < (short)uVar54) * uVar54 |
                                    (ushort)(local_7a8 >= (short)uVar54) * local_7a8);
            result._0_6_ = CONCAT24((sStack_7a4 < (short)uVar59) * uVar59 |
                                    (ushort)(sStack_7a4 >= (short)uVar59) * sStack_7a4,result._0_4_)
            ;
            result = (parasail_result_t *)
                     CONCAT26((sStack_7a2 < (short)uVar61) * uVar61 |
                              (ushort)(sStack_7a2 >= (short)uVar61) * sStack_7a2,result._0_6_);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((sStack_79e < (short)uVar66) * uVar66 |
                          (ushort)(sStack_79e >= (short)uVar66) * sStack_79e,
                          (sStack_7a0 < (short)uVar63) * uVar63 |
                          (ushort)(sStack_7a0 >= (short)uVar63) * sStack_7a0);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((sStack_79c < (short)uVar68) * uVar68 |
                          (ushort)(sStack_79c >= (short)uVar68) * sStack_79c,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_79a < (short)uVar70) * uVar70 |
                          (ushort)(sStack_79a >= (short)uVar70) * sStack_79a,
                          (undefined6)vSaturationCheckMax[0]);
            local_6e8 = (short)vSaturationCheckMax[1];
            sStack_6e6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_6e4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_6e2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_6e0 = (short)vSaturationCheckMin[0];
            sStack_6de = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_6dc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_6da = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            uVar56 = ((short)uVar54 < local_6e8) * uVar54 |
                     (ushort)((short)uVar54 >= local_6e8) * local_6e8;
            uVar58 = ((short)uVar57 < sStack_6e6) * uVar57 |
                     (ushort)((short)uVar57 >= sStack_6e6) * sStack_6e6;
            uVar60 = ((short)uVar59 < sStack_6e4) * uVar59 |
                     (ushort)((short)uVar59 >= sStack_6e4) * sStack_6e4;
            uVar62 = ((short)uVar61 < sStack_6e2) * uVar61 |
                     (ushort)((short)uVar61 >= sStack_6e2) * sStack_6e2;
            uVar65 = ((short)uVar63 < sStack_6e0) * uVar63 |
                     (ushort)((short)uVar63 >= sStack_6e0) * sStack_6e0;
            uVar67 = ((short)uVar66 < sStack_6de) * uVar66 |
                     (ushort)((short)uVar66 >= sStack_6de) * sStack_6de;
            uVar69 = ((short)uVar68 < sStack_6dc) * uVar68 |
                     (ushort)((short)uVar68 >= sStack_6dc) * sStack_6dc;
            uVar71 = ((short)uVar70 < sStack_6da) * uVar70 |
                     (ushort)((short)uVar70 >= sStack_6da) * sStack_6da;
            uVar56 = (ushort)(local_778 < (short)uVar56) * local_778 |
                     (local_778 >= (short)uVar56) * uVar56;
            uVar58 = (ushort)(sStack_776 < (short)uVar58) * sStack_776 |
                     (sStack_776 >= (short)uVar58) * uVar58;
            uVar60 = (ushort)(sStack_774 < (short)uVar60) * sStack_774 |
                     (sStack_774 >= (short)uVar60) * uVar60;
            uVar62 = (ushort)(sStack_772 < (short)uVar62) * sStack_772 |
                     (sStack_772 >= (short)uVar62) * uVar62;
            uVar65 = (ushort)(sStack_770 < (short)uVar65) * sStack_770 |
                     (sStack_770 >= (short)uVar65) * uVar65;
            uVar67 = (ushort)(sStack_76e < (short)uVar67) * sStack_76e |
                     (sStack_76e >= (short)uVar67) * uVar67;
            uVar69 = (ushort)(sStack_76c < (short)uVar69) * sStack_76c |
                     (sStack_76c >= (short)uVar69) * uVar69;
            uVar71 = (ushort)(sStack_76a < (short)uVar71) * sStack_76a |
                     (sStack_76a >= (short)uVar71) * uVar71;
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22(((short)uStack_796 < (short)uVar58) * uStack_796 |
                          ((short)uStack_796 >= (short)uVar58) * uVar58,
                          ((short)local_798 < (short)uVar56) * local_798 |
                          ((short)local_798 >= (short)uVar56) * uVar56);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24(((short)uStack_794 < (short)uVar60) * uStack_794 |
                          ((short)uStack_794 >= (short)uVar60) * uVar60,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uStack_792 < (short)uVar62) * uStack_792 |
                          ((short)uStack_792 >= (short)uVar62) * uVar62,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22(((short)uStack_78e < (short)uVar67) * uStack_78e |
                          ((short)uStack_78e >= (short)uVar67) * uVar67,
                          ((short)uStack_790 < (short)uVar65) * uStack_790 |
                          ((short)uStack_790 >= (short)uVar65) * uVar65);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24(((short)uStack_78c < (short)uVar69) * uStack_78c |
                          ((short)uStack_78c >= (short)uVar69) * uVar69,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uStack_78a < (short)uVar71) * uStack_78a |
                          ((short)uStack_78a >= (short)uVar71) * uVar71,
                          (undefined6)vSaturationCheckMin[0]);
            arr_load((__m128i *)
                     ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                     rowcols->score_row,k,a,s1Len);
            auVar28._2_2_ = -(ushort)(uVar57 == uStack_796);
            auVar28._0_2_ = -(ushort)(uVar54 == local_798);
            auVar28._4_2_ = -(ushort)(uVar59 == uStack_794);
            auVar28._6_2_ = -(ushort)(uVar61 == uStack_792);
            auVar28._10_2_ = -(ushort)(uVar66 == uStack_78e);
            auVar28._8_2_ = -(ushort)(uVar63 == uStack_790);
            auVar28._12_2_ = -(ushort)(uVar68 == uStack_78c);
            auVar28._14_2_ = -(ushort)(uVar70 == uStack_78a);
            auVar30._8_8_ = 0x1000100010001;
            auVar30._0_8_ = 0x1000100010001;
            auVar29._8_8_ = 0x2000200020002;
            auVar29._0_8_ = 0x2000200020002;
            auVar55 = pblendvb(auVar30,auVar29,auVar28);
            auVar26._2_2_ = -(ushort)(uVar57 == uStack_766);
            auVar26._0_2_ = -(ushort)(uVar54 == local_768);
            auVar26._4_2_ = -(ushort)(uVar59 == uStack_764);
            auVar26._6_2_ = -(ushort)(uVar61 == uStack_762);
            auVar26._10_2_ = -(ushort)(uVar66 == uStack_75e);
            auVar26._8_2_ = -(ushort)(uVar63 == uStack_760);
            auVar26._12_2_ = -(ushort)(uVar68 == uStack_75c);
            auVar26._14_2_ = -(ushort)(uVar70 == uStack_75a);
            auVar27._8_8_ = 0x4000400040004;
            auVar27._0_8_ = 0x4000400040004;
            auVar55 = pblendvb(auVar55,auVar27,auVar26);
            vEa[1] = auVar55._0_8_;
            vT[0] = auVar55._8_8_;
            ptr_00[k][0] = vEa[1];
            ptr_00[k][1] = vT[0];
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = a;
            vH_00[1]._4_4_ = 0;
            arr_store((__m128i *)
                      ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                      rowcols->score_row,vH_00,s1Len,seglen,in_R9D);
            auVar43._8_8_ = vH[0];
            auVar43._0_8_ = vH_dag[1];
            auVar42._8_8_ = uVar7;
            auVar42._0_8_ = uVar4;
            register0x00001200 = psubsw(auVar43,auVar42);
            auVar41._8_8_ = uVar8;
            auVar41._0_8_ = uVar5;
            auVar55 = psubsw((undefined1  [16])alVar72,auVar41);
            local_7c8 = (short)vE[1];
            sStack_7c6 = vE[1]._2_2_;
            sStack_7c4 = vE[1]._4_2_;
            sStack_7c2 = vE[1]._6_2_;
            sStack_7c0 = (short)vE[2];
            sStack_7be = vE[2]._2_2_;
            sStack_7bc = vE[2]._4_2_;
            sStack_7ba = vE[2]._6_2_;
            local_7d8 = auVar55._0_2_;
            sStack_7d6 = auVar55._2_2_;
            sStack_7d4 = auVar55._4_2_;
            sStack_7d2 = auVar55._6_2_;
            sStack_7d0 = auVar55._8_2_;
            sStack_7ce = auVar55._10_2_;
            sStack_7cc = auVar55._12_2_;
            sStack_7ca = auVar55._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_7c2 < sStack_7d2) * sStack_7d2 |
                                 (ushort)(sStack_7c2 >= sStack_7d2) * sStack_7c2,
                                 CONCAT24((ushort)(sStack_7c4 < sStack_7d4) * sStack_7d4 |
                                          (ushort)(sStack_7c4 >= sStack_7d4) * sStack_7c4,
                                          CONCAT22((ushort)(sStack_7c6 < sStack_7d6) * sStack_7d6 |
                                                   (ushort)(sStack_7c6 >= sStack_7d6) * sStack_7c6,
                                                   (ushort)(local_7c8 < local_7d8) * local_7d8 |
                                                   (ushort)(local_7c8 >= local_7d8) * local_7c8)));
            vE[0] = CONCAT26((ushort)(sStack_7ba < sStack_7ca) * sStack_7ca |
                             (ushort)(sStack_7ba >= sStack_7ca) * sStack_7ba,
                             CONCAT24((ushort)(sStack_7bc < sStack_7cc) * sStack_7cc |
                                      (ushort)(sStack_7bc >= sStack_7cc) * sStack_7bc,
                                      CONCAT22((ushort)(sStack_7be < sStack_7ce) * sStack_7ce |
                                               (ushort)(sStack_7be >= sStack_7ce) * sStack_7be,
                                               (ushort)(sStack_7c0 < sStack_7d0) * sStack_7d0 |
                                               (ushort)(sStack_7c0 >= sStack_7d0) * sStack_7c0)));
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            auVar40._8_8_ = uVar8;
            auVar40._0_8_ = uVar5;
            auVar55 = psubsw((undefined1  [16])palVar47[k],auVar40);
            local_7f8 = auVar55._0_2_;
            sStack_7f6 = auVar55._2_2_;
            sStack_7f4 = auVar55._4_2_;
            sStack_7f2 = auVar55._6_2_;
            sStack_7f0 = auVar55._8_2_;
            sStack_7ee = auVar55._10_2_;
            sStack_7ec = auVar55._12_2_;
            sStack_7ea = auVar55._14_2_;
            vEa_ext[1] = CONCAT26((ushort)(sStack_7c2 < sStack_7f2) * sStack_7f2 |
                                  (ushort)(sStack_7c2 >= sStack_7f2) * sStack_7c2,
                                  CONCAT24((ushort)(sStack_7c4 < sStack_7f4) * sStack_7f4 |
                                           (ushort)(sStack_7c4 >= sStack_7f4) * sStack_7c4,
                                           CONCAT22((ushort)(sStack_7c6 < sStack_7f6) * sStack_7f6 |
                                                    (ushort)(sStack_7c6 >= sStack_7f6) * sStack_7c6,
                                                    (ushort)(local_7c8 < local_7f8) * local_7f8 |
                                                    (ushort)(local_7c8 >= local_7f8) * local_7c8)));
            vEa[0] = CONCAT26((ushort)(sStack_7ba < sStack_7ea) * sStack_7ea |
                              (ushort)(sStack_7ba >= sStack_7ea) * sStack_7ba,
                              CONCAT24((ushort)(sStack_7bc < sStack_7ec) * sStack_7ec |
                                       (ushort)(sStack_7bc >= sStack_7ec) * sStack_7bc,
                                       CONCAT22((ushort)(sStack_7be < sStack_7ee) * sStack_7ee |
                                                (ushort)(sStack_7be >= sStack_7ee) * sStack_7be,
                                                (ushort)(sStack_7c0 < sStack_7f0) * sStack_7f0 |
                                                (ushort)(sStack_7c0 >= sStack_7f0) * sStack_7c0)));
            palVar46[k][0] = vEa_ext[1];
            palVar46[k][1] = vEa[0];
            if (s1Len + 1 < s2Len) {
              auVar23._2_2_ = -(ushort)(sStack_7f6 < sStack_7c6);
              auVar23._0_2_ = -(ushort)(local_7f8 < local_7c8);
              auVar23._4_2_ = -(ushort)(sStack_7f4 < sStack_7c4);
              auVar23._6_2_ = -(ushort)(sStack_7f2 < sStack_7c2);
              auVar23._10_2_ = -(ushort)(sStack_7ee < sStack_7be);
              auVar23._8_2_ = -(ushort)(sStack_7f0 < sStack_7c0);
              auVar23._12_2_ = -(ushort)(sStack_7ec < sStack_7bc);
              auVar23._14_2_ = -(ushort)(sStack_7ea < sStack_7ba);
              auVar25._8_8_ = 0x10001000100010;
              auVar25._0_8_ = 0x10001000100010;
              auVar24._8_8_ = 0x8000800080008;
              auVar24._0_8_ = 0x8000800080008;
              pblendvb(auVar25,auVar24,auVar23);
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = a;
              vH_01[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_01,s1Len + 1,seglen,in_R9D);
            }
            auVar39._8_8_ = vF[0];
            auVar39._0_8_ = vF_ext[1];
            auVar38._8_8_ = uVar8;
            auVar38._0_8_ = uVar5;
            register0x00001200 = psubsw(auVar39,auVar38);
            local_818 = (short)vFa[1];
            sStack_816 = vFa[1]._2_2_;
            sStack_814 = vFa[1]._4_2_;
            sStack_812 = vFa[1]._6_2_;
            sStack_810 = (short)vFa[2];
            sStack_80e = vFa[2]._2_2_;
            sStack_80c = vFa[2]._4_2_;
            sStack_80a = vFa[2]._6_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_7c2 < sStack_812) * sStack_812 |
                                 (ushort)(sStack_7c2 >= sStack_812) * sStack_7c2,
                                 CONCAT24((ushort)(sStack_7c4 < sStack_814) * sStack_814 |
                                          (ushort)(sStack_7c4 >= sStack_814) * sStack_7c4,
                                          CONCAT22((ushort)(sStack_7c6 < sStack_816) * sStack_816 |
                                                   (ushort)(sStack_7c6 >= sStack_816) * sStack_7c6,
                                                   (ushort)(local_7c8 < local_818) * local_818 |
                                                   (ushort)(local_7c8 >= local_818) * local_7c8)));
            vF[0] = CONCAT26((ushort)(sStack_7ba < sStack_80a) * sStack_80a |
                             (ushort)(sStack_7ba >= sStack_80a) * sStack_7ba,
                             CONCAT24((ushort)(sStack_7bc < sStack_80c) * sStack_80c |
                                      (ushort)(sStack_7bc >= sStack_80c) * sStack_7bc,
                                      CONCAT22((ushort)(sStack_7be < sStack_80e) * sStack_80e |
                                               (ushort)(sStack_7be >= sStack_80e) * sStack_7be,
                                               (ushort)(sStack_7c0 < sStack_810) * sStack_810 |
                                               (ushort)(sStack_7c0 >= sStack_810) * sStack_7c0)));
            if (k + 1 < a) {
              arr_load((__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row,k + 1,a,s1Len);
              auVar20._2_2_ = -(ushort)(sStack_816 < sStack_7c6);
              auVar20._0_2_ = -(ushort)(local_818 < local_7c8);
              auVar20._4_2_ = -(ushort)(sStack_814 < sStack_7c4);
              auVar20._6_2_ = -(ushort)(sStack_812 < sStack_7c2);
              auVar20._10_2_ = -(ushort)(sStack_80e < sStack_7be);
              auVar20._8_2_ = -(ushort)(sStack_810 < sStack_7c0);
              auVar20._12_2_ = -(ushort)(sStack_80c < sStack_7bc);
              auVar20._14_2_ = -(ushort)(sStack_80a < sStack_7ba);
              auVar22._8_8_ = 0x40004000400040;
              auVar22._0_8_ = 0x40004000400040;
              auVar21._8_8_ = 0x20002000200020;
              auVar21._0_8_ = 0x20002000200020;
              pblendvb(auVar22,auVar21,auVar20);
              vH_02[0] = (ulong)(k + 1);
              vH_02[1]._0_4_ = a;
              vH_02[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_02,s1Len,seglen,in_R9D);
            }
            vH_dag[1] = palVar49[k][0];
            vH[0] = palVar49[k][1];
          }
          stack0xfffffffffffff308 = stack0xfffffffffffff328;
          vFa_ext[1] = vF_ext[1];
          vFa[0] = vF[0];
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            local_f18 = (ulong)(ptr_01[s1Len + 1] - open);
            if ((long)local_f18 < -0x8000) {
              local_f18 = 0xffffffffffff8000;
            }
            uVar64 = palVar49[a + -1][0];
            vHp[0] = palVar49[a + -1][1] << 0x10 | uVar64 >> 0x30;
            vTAll_2[1] = uVar64 << 0x10 | (ulong)(ushort)ptr_01[s1Len];
            vEF_opn[0] = vEF_opn[0] << 0x10 | (ulong)vE[1] >> 0x30;
            vE[1] = vE[1] << 0x10 | local_f18 & 0xffff;
            vF_ext[0] = vF_ext[0] << 0x10 | (ulong)vFa[1] >> 0x30;
            vFa[1] = vFa[1] << 0x10 | (ulong)uVar50;
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vF_ext[1] = vF_ext[1] << 0x10 | local_f18 & 0xffff;
            vFa_ext[0] = vFa_ext[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | (ulong)uVar50;
            vFa[0] = vFa[0] << 0x10 | (ulong)vFa_ext[1] >> 0x30;
            vFa_ext[1] = vFa_ext[1] << 0x10 | local_f18 & 0xffff;
            for (k = 0; k < a; k = k + 1) {
              lVar10 = palVar48[k][0];
              lVar11 = palVar48[k][1];
              local_828 = (short)lVar10;
              sStack_826 = (short)((ulong)lVar10 >> 0x10);
              sStack_824 = (short)((ulong)lVar10 >> 0x20);
              sStack_822 = (short)((ulong)lVar10 >> 0x30);
              sStack_820 = (short)lVar11;
              sStack_81e = (short)((ulong)lVar11 >> 0x10);
              sStack_81c = (short)((ulong)lVar11 >> 0x20);
              sStack_81a = (short)((ulong)lVar11 >> 0x30);
              local_838 = (ushort)vF_ext[1];
              uStack_836 = (ushort)((ulong)vF_ext[1] >> 0x10);
              uStack_834 = (ushort)((ulong)vF_ext[1] >> 0x20);
              uStack_832 = (ushort)((ulong)vF_ext[1] >> 0x30);
              uStack_830 = (ushort)vF[0];
              uStack_82e = (ushort)((ulong)vF[0] >> 0x10);
              uStack_82c = (ushort)((ulong)vF[0] >> 0x20);
              uStack_82a = (ushort)((ulong)vF[0] >> 0x30);
              uVar54 = (local_828 < (short)local_838) * local_838 |
                       (ushort)(local_828 >= (short)local_838) * local_828;
              uVar56 = (sStack_826 < (short)uStack_836) * uStack_836 |
                       (ushort)(sStack_826 >= (short)uStack_836) * sStack_826;
              uVar57 = (sStack_824 < (short)uStack_834) * uStack_834 |
                       (ushort)(sStack_824 >= (short)uStack_834) * sStack_824;
              uVar58 = (sStack_822 < (short)uStack_832) * uStack_832 |
                       (ushort)(sStack_822 >= (short)uStack_832) * sStack_822;
              uVar59 = (sStack_820 < (short)uStack_830) * uStack_830 |
                       (ushort)(sStack_820 >= (short)uStack_830) * sStack_820;
              uVar60 = (sStack_81e < (short)uStack_82e) * uStack_82e |
                       (ushort)(sStack_81e >= (short)uStack_82e) * sStack_81e;
              uVar61 = (sStack_81c < (short)uStack_82c) * uStack_82c |
                       (ushort)(sStack_81c >= (short)uStack_82c) * sStack_81c;
              uVar62 = (sStack_81a < (short)uStack_82a) * uStack_82a |
                       (ushort)(sStack_81a >= (short)uStack_82a) * sStack_81a;
              vH_dag[1]._0_4_ = CONCAT22(uVar56,uVar54);
              vH_dag[1]._0_6_ = CONCAT24(uVar57,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar58,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar60,uVar59);
              vH[0]._0_6_ = CONCAT24(uVar61,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar62,(undefined6)vH[0]);
              palVar48[k][0] = vH_dag[1];
              palVar48[k][1] = vH[0];
              local_748 = (short)vSaturationCheckMax[1];
              sStack_746 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_744 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_742 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_740 = (short)vSaturationCheckMin[0];
              sStack_73e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_73c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_73a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar56 < sStack_746) * uVar56 |
                            (ushort)((short)uVar56 >= sStack_746) * sStack_746,
                            ((short)uVar54 < local_748) * uVar54 |
                            (ushort)((short)uVar54 >= local_748) * local_748);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar57 < sStack_744) * uVar57 |
                            (ushort)((short)uVar57 >= sStack_744) * sStack_744,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar58 < sStack_742) * uVar58 |
                            (ushort)((short)uVar58 >= sStack_742) * sStack_742,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar60 < sStack_73e) * uVar60 |
                            (ushort)((short)uVar60 >= sStack_73e) * sStack_73e,
                            ((short)uVar59 < sStack_740) * uVar59 |
                            (ushort)((short)uVar59 >= sStack_740) * sStack_740);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar61 < sStack_73c) * uVar61 |
                            (ushort)((short)uVar61 >= sStack_73c) * sStack_73c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar62 < sStack_73a) * uVar62 |
                            (ushort)((short)uVar62 >= sStack_73a) * sStack_73a,
                            (undefined6)vSaturationCheckMin[0]);
              local_848 = (short)result;
              sStack_846 = (short)((ulong)result >> 0x10);
              sStack_844 = (short)((ulong)result >> 0x20);
              sStack_842 = (short)((ulong)result >> 0x30);
              sStack_840 = (short)vSaturationCheckMax[0];
              sStack_83e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_83c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_83a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              result._0_4_ = CONCAT22((sStack_846 < (short)uVar56) * uVar56 |
                                      (ushort)(sStack_846 >= (short)uVar56) * sStack_846,
                                      (local_848 < (short)uVar54) * uVar54 |
                                      (ushort)(local_848 >= (short)uVar54) * local_848);
              result._0_6_ = CONCAT24((sStack_844 < (short)uVar57) * uVar57 |
                                      (ushort)(sStack_844 >= (short)uVar57) * sStack_844,
                                      result._0_4_);
              result = (parasail_result_t *)
                       CONCAT26((sStack_842 < (short)uVar58) * uVar58 |
                                (ushort)(sStack_842 >= (short)uVar58) * sStack_842,result._0_6_);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((sStack_83e < (short)uVar60) * uVar60 |
                            (ushort)(sStack_83e >= (short)uVar60) * sStack_83e,
                            (sStack_840 < (short)uVar59) * uVar59 |
                            (ushort)(sStack_840 >= (short)uVar59) * sStack_840);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((sStack_83c < (short)uVar61) * uVar61 |
                            (ushort)(sStack_83c >= (short)uVar61) * sStack_83c,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((sStack_83a < (short)uVar62) * uVar62 |
                            (ushort)(sStack_83a >= (short)uVar62) * sStack_83a,
                            (undefined6)vSaturationCheckMax[0]);
              auVar55 = paddsw((undefined1  [16])stack0xfffffffffffff1f8,
                               *(undefined1 (*) [16])
                                ((long)pvVar3 + (long)k * 0x10 + (long)iVar52 * 0x10));
              local_698 = auVar55._0_2_;
              uStack_696 = auVar55._2_2_;
              uStack_694 = auVar55._4_2_;
              uStack_692 = auVar55._6_2_;
              uStack_690 = auVar55._8_2_;
              uStack_68e = auVar55._10_2_;
              uStack_68c = auVar55._12_2_;
              uStack_68a = auVar55._14_2_;
              arr_load((__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row,k,a,s1Len);
              auVar19._8_8_ = 0x2000200020002;
              auVar19._0_8_ = 0x2000200020002;
              auVar18._8_8_ =
                   ~CONCAT26(-(ushort)(uVar62 == uStack_68a),
                             CONCAT24(-(ushort)(uVar61 == uStack_68c),
                                      CONCAT22(-(ushort)(uVar60 == uStack_68e),
                                               -(ushort)(uVar59 == uStack_690)))) &
                   CONCAT26(-(ushort)(uVar62 == uStack_82a),
                            CONCAT24(-(ushort)(uVar61 == uStack_82c),
                                     CONCAT22(-(ushort)(uVar60 == uStack_82e),
                                              -(ushort)(uVar59 == uStack_830))));
              auVar18._0_8_ =
                   ~CONCAT26(-(ushort)(uVar58 == uStack_692),
                             CONCAT24(-(ushort)(uVar57 == uStack_694),
                                      CONCAT22(-(ushort)(uVar56 == uStack_696),
                                               -(ushort)(uVar54 == local_698)))) &
                   CONCAT26(-(ushort)(uVar58 == uStack_832),
                            CONCAT24(-(ushort)(uVar57 == uStack_834),
                                     CONCAT22(-(ushort)(uVar56 == uStack_836),
                                              -(ushort)(uVar54 == local_838))));
              auVar55 = pblendvb((undefined1  [16])ptr_00[k],auVar19,auVar18);
              case1_1[1] = auVar55._0_8_;
              vT_3[0] = auVar55._8_8_;
              ptr_00[k][0] = case1_1[1];
              ptr_00[k][1] = vT_3[0];
              vH_03[0] = (ulong)(uint)k;
              vH_03[1]._0_4_ = a;
              vH_03[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_03,s1Len,seglen,in_R9D);
              arr_load((__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row,k,a,s1Len);
              local_2b8 = (short)vE[1];
              sStack_2b6 = vE[1]._2_2_;
              sStack_2b4 = vE[1]._4_2_;
              sStack_2b2 = vE[1]._6_2_;
              sStack_2b0 = (short)vE[2];
              sStack_2ae = vE[2]._2_2_;
              sStack_2ac = vE[2]._4_2_;
              sStack_2aa = vE[2]._6_2_;
              local_2c8 = (short)vH[1];
              sStack_2c6 = vH[1]._2_2_;
              sStack_2c4 = vH[1]._4_2_;
              sStack_2c2 = vH[1]._6_2_;
              sStack_2c0 = (short)vH[2];
              sStack_2be = vH[2]._2_2_;
              sStack_2bc = vH[2]._4_2_;
              sStack_2ba = vH[2]._6_2_;
              auVar15._2_2_ = -(ushort)(sStack_2c6 < sStack_2b6);
              auVar15._0_2_ = -(ushort)(local_2c8 < local_2b8);
              auVar15._4_2_ = -(ushort)(sStack_2c4 < sStack_2b4);
              auVar15._6_2_ = -(ushort)(sStack_2c2 < sStack_2b2);
              auVar15._10_2_ = -(ushort)(sStack_2be < sStack_2ae);
              auVar15._8_2_ = -(ushort)(sStack_2c0 < sStack_2b0);
              auVar15._12_2_ = -(ushort)(sStack_2bc < sStack_2ac);
              auVar15._14_2_ = -(ushort)(sStack_2ba < sStack_2aa);
              auVar17._8_8_ = 0x40004000400040;
              auVar17._0_8_ = 0x40004000400040;
              auVar16._8_8_ = 0x20002000200020;
              auVar16._0_8_ = 0x20002000200020;
              pblendvb(auVar17,auVar16,auVar15);
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = a;
              vH_04[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_04,s1Len,seglen,in_R9D);
              auVar37._8_8_ = vH[0];
              auVar37._0_8_ = vH_dag[1];
              auVar36._8_8_ = uVar7;
              auVar36._0_8_ = uVar4;
              register0x00001200 = psubsw(auVar37,auVar36);
              auVar35._8_8_ = vF[0];
              auVar35._0_8_ = vF_ext[1];
              auVar34._8_8_ = uVar8;
              auVar34._0_8_ = uVar5;
              register0x00001200 = psubsw(auVar35,auVar34);
              auVar33._8_8_ = uVar8;
              auVar33._0_8_ = uVar5;
              auVar55 = psubsw((undefined1  [16])palVar47[k],auVar33);
              local_868 = (short)vE[1];
              sStack_866 = vE[1]._2_2_;
              sStack_864 = vE[1]._4_2_;
              sStack_862 = vE[1]._6_2_;
              sStack_860 = (short)vE[2];
              sStack_85e = vE[2]._2_2_;
              sStack_85c = vE[2]._4_2_;
              sStack_85a = vE[2]._6_2_;
              local_878 = auVar55._0_2_;
              sStack_876 = auVar55._2_2_;
              sStack_874 = auVar55._4_2_;
              sStack_872 = auVar55._6_2_;
              sStack_870 = auVar55._8_2_;
              sStack_86e = auVar55._10_2_;
              sStack_86c = auVar55._12_2_;
              sStack_86a = auVar55._14_2_;
              vEa_ext_1[1] = CONCAT26((ushort)(sStack_862 < sStack_872) * sStack_872 |
                                      (ushort)(sStack_862 >= sStack_872) * sStack_862,
                                      CONCAT24((ushort)(sStack_864 < sStack_874) * sStack_874 |
                                               (ushort)(sStack_864 >= sStack_874) * sStack_864,
                                               CONCAT22((ushort)(sStack_866 < sStack_876) *
                                                        sStack_876 |
                                                        (ushort)(sStack_866 >= sStack_876) *
                                                        sStack_866,
                                                        (ushort)(local_868 < local_878) * local_878
                                                        | (ushort)(local_868 >= local_878) *
                                                          local_868)));
              vEa_1[0] = CONCAT26((ushort)(sStack_85a < sStack_86a) * sStack_86a |
                                  (ushort)(sStack_85a >= sStack_86a) * sStack_85a,
                                  CONCAT24((ushort)(sStack_85c < sStack_86c) * sStack_86c |
                                           (ushort)(sStack_85c >= sStack_86c) * sStack_85c,
                                           CONCAT22((ushort)(sStack_85e < sStack_86e) * sStack_86e |
                                                    (ushort)(sStack_85e >= sStack_86e) * sStack_85e,
                                                    (ushort)(sStack_860 < sStack_870) * sStack_870 |
                                                    (ushort)(sStack_860 >= sStack_870) * sStack_860)
                                          ));
              palVar46[k][0] = vEa_ext_1[1];
              palVar46[k][1] = vEa_1[0];
              if (s1Len + 1 < s2Len) {
                auVar12._2_2_ = -(ushort)(sStack_876 < sStack_866);
                auVar12._0_2_ = -(ushort)(local_878 < local_868);
                auVar12._4_2_ = -(ushort)(sStack_874 < sStack_864);
                auVar12._6_2_ = -(ushort)(sStack_872 < sStack_862);
                auVar12._10_2_ = -(ushort)(sStack_86e < sStack_85e);
                auVar12._8_2_ = -(ushort)(sStack_870 < sStack_860);
                auVar12._12_2_ = -(ushort)(sStack_86c < sStack_85c);
                auVar12._14_2_ = -(ushort)(sStack_86a < sStack_85a);
                auVar14._8_8_ = 0x10001000100010;
                auVar14._0_8_ = 0x10001000100010;
                auVar13._8_8_ = 0x8000800080008;
                auVar13._0_8_ = 0x8000800080008;
                pblendvb(auVar14,auVar13,auVar12);
                vH_05[0] = (ulong)(uint)k;
                vH_05[1]._0_4_ = a;
                vH_05[1]._4_4_ = 0;
                arr_store((__m128i *)
                          ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)
                          ->rowcols->score_row,vH_05,s1Len + 1,seglen,in_R9D);
              }
              local_2f8 = (short)vFa[1];
              sStack_2f6 = vFa[1]._2_2_;
              sStack_2f4 = vFa[1]._4_2_;
              sStack_2f2 = vFa[1]._6_2_;
              sStack_2f0 = (short)vFa[2];
              sStack_2ee = vFa[2]._2_2_;
              sStack_2ec = vFa[2]._4_2_;
              sStack_2ea = vFa[2]._6_2_;
              uVar64 = CONCAT26(-(ushort)(sStack_85a < sStack_2ea),
                                CONCAT24(-(ushort)(sStack_85c < sStack_2ec),
                                         CONCAT22(-(ushort)(sStack_85e < sStack_2ee),
                                                  -(ushort)(sStack_860 < sStack_2f0)))) |
                       CONCAT26(-(ushort)(sStack_2ea == sStack_85a),
                                CONCAT24(-(ushort)(sStack_2ec == sStack_85c),
                                         CONCAT22(-(ushort)(sStack_2ee == sStack_85e),
                                                  -(ushort)(sStack_2f0 == sStack_860))));
              auVar45._8_8_ = uVar64;
              auVar45._0_8_ =
                   CONCAT26(-(ushort)(sStack_862 < sStack_2f2),
                            CONCAT24(-(ushort)(sStack_864 < sStack_2f4),
                                     CONCAT22(-(ushort)(sStack_866 < sStack_2f6),
                                              -(ushort)(local_868 < local_2f8)))) |
                   CONCAT26(-(ushort)(sStack_2f2 == sStack_862),
                            CONCAT24(-(ushort)(sStack_2f4 == sStack_864),
                                     CONCAT22(-(ushort)(sStack_2f6 == sStack_866),
                                              -(ushort)(local_2f8 == local_868))));
              if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar45 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar45 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar45 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar45 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar45 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uVar64 >> 7 & 1) == 0) && (uVar64 >> 0xf & 1) == 0) &&
                      (uVar64 >> 0x17 & 1) == 0) && (uVar64 >> 0x1f & 1) == 0) &&
                    (uVar64 >> 0x27 & 1) == 0) && (uVar64 >> 0x2f & 1) == 0) &&
                  (uVar64 >> 0x37 & 1) == 0) && -1 < (long)uVar64) goto LAB_00b5ff44;
              vF_ext[1] = vFa[1];
              vF[0] = vF_ext[0];
              auVar32._8_8_ = vFa[0];
              auVar32._0_8_ = vFa_ext[1];
              auVar31._8_8_ = uVar8;
              auVar31._0_8_ = uVar5;
              register0x00001200 = psubsw(auVar32,auVar31);
              local_898 = (short)vH[1];
              sStack_896 = vH[1]._2_2_;
              sStack_894 = vH[1]._4_2_;
              sStack_892 = vH[1]._6_2_;
              sStack_890 = (short)vH[2];
              sStack_88e = vH[2]._2_2_;
              sStack_88c = vH[2]._4_2_;
              sStack_88a = vH[2]._6_2_;
              vFa_ext[1] = CONCAT26((ushort)(sStack_862 < sStack_892) * sStack_892 |
                                    (ushort)(sStack_862 >= sStack_892) * sStack_862,
                                    CONCAT24((ushort)(sStack_864 < sStack_894) * sStack_894 |
                                             (ushort)(sStack_864 >= sStack_894) * sStack_864,
                                             CONCAT22((ushort)(sStack_866 < sStack_896) * sStack_896
                                                      | (ushort)(sStack_866 >= sStack_896) *
                                                        sStack_866,
                                                      (ushort)(local_868 < local_898) * local_898 |
                                                      (ushort)(local_868 >= local_898) * local_868))
                                   );
              vFa[0] = CONCAT26((ushort)(sStack_85a < sStack_88a) * sStack_88a |
                                (ushort)(sStack_85a >= sStack_88a) * sStack_85a,
                                CONCAT24((ushort)(sStack_85c < sStack_88c) * sStack_88c |
                                         (ushort)(sStack_85c >= sStack_88c) * sStack_85c,
                                         CONCAT22((ushort)(sStack_85e < sStack_88e) * sStack_88e |
                                                  (ushort)(sStack_85e >= sStack_88e) * sStack_85e,
                                                  (ushort)(sStack_860 < sStack_890) * sStack_890 |
                                                  (ushort)(sStack_860 >= sStack_890) * sStack_860)))
              ;
              unique0x100046ac = palVar49[k];
            }
          }
LAB_00b5ff44:
        }
        vH_1[0] = pvHLoad[(iVar1 + -1) % a][1];
        uStack_ed8 = pvHLoad[(iVar1 + -1) % a][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / a) + 8U); end_query = end_query + 1)
        {
          vH_1[0] = vH_1[0] << 0x10 | uStack_ed8 >> 0x30;
          uStack_ed8 = uStack_ed8 << 0x10;
        }
        local_b5e = vH_1[0]._6_2_;
        local_1c8 = (short)vSaturationCheckMax[1];
        sStack_1c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_1c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_1c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_1c0 = (short)vSaturationCheckMin[0];
        sStack_1be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_318 = (short)result;
        sStack_316 = (short)((ulong)result >> 0x10);
        sStack_314 = (short)((ulong)result >> 0x20);
        sStack_312 = (short)((ulong)result >> 0x30);
        sStack_310 = (short)vSaturationCheckMax[0];
        sStack_30e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_30c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_30a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar64 = CONCAT26(-(ushort)(sStack_1ba < (short)uVar50),
                          CONCAT24(-(ushort)(sStack_1bc < (short)uVar50),
                                   CONCAT22(-(ushort)(sStack_1be < (short)uVar50),
                                            -(ushort)(sStack_1c0 < (short)uVar50)))) |
                 CONCAT26(-(ushort)(sVar51 < sStack_30a),
                          CONCAT24(-(ushort)(sVar51 < sStack_30c),
                                   CONCAT22(-(ushort)(sVar51 < sStack_30e),
                                            -(ushort)(sVar51 < sStack_310))));
        auVar44._8_8_ = uVar64;
        auVar44._0_8_ =
             CONCAT26(-(ushort)(sStack_1c2 < (short)uVar50),
                      CONCAT24(-(ushort)(sStack_1c4 < (short)uVar50),
                               CONCAT22(-(ushort)(sStack_1c6 < (short)uVar50),
                                        -(ushort)(local_1c8 < (short)uVar50)))) |
             CONCAT26(-(ushort)(sVar51 < sStack_312),
                      CONCAT24(-(ushort)(sVar51 < sStack_314),
                               CONCAT22(-(ushort)(sVar51 < sStack_316),-(ushort)(sVar51 < local_318)
                                       )));
        if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar44 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar44 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar44 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar44 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar64 >> 7 & 1) != 0) || (uVar64 >> 0xf & 1) != 0) || (uVar64 >> 0x17 & 1) != 0)
               || (uVar64 >> 0x1f & 1) != 0) || (uVar64 >> 0x27 & 1) != 0) ||
             (uVar64 >> 0x2f & 1) != 0) || (uVar64 >> 0x37 & 1) != 0) || (long)uVar64 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_b5e = 0;
          local_ad0 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)local_b5e;
        *(int *)((long)&profile_local->s1 + 4) = local_ad0;
        profile_local->s1Len = matrix._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(pvHT);
        parasail_free(pvEaLoad);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8(
                        _mm_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}